

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

bool __thiscall
gl3cts::ClipDistance::CoverageTest::EnableDisableTest(CoverageTest *this,Functions *gl)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  
  iVar3 = 0;
  do {
    iVar2 = this->m_gl_max_clip_distances_value;
    if (iVar2 <= iVar3) {
      iVar3 = 0;
      while( true ) {
        if (iVar2 <= iVar3) {
          return true;
        }
        (*gl->disable)(iVar3 + 0x3000);
        local_1b0.m_value = (*gl->getError)();
        if (local_1b0.m_value != 0) break;
        iVar3 = iVar3 + 1;
        iVar2 = this->m_gl_max_clip_distances_value;
      }
      local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"glDisable(GL_CLIP_DISTANCE");
      std::ostream::operator<<(poVar1,iVar3);
      std::operator<<((ostream *)poVar1,") returned error code ");
      local_1b0.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," instead of GL_NO_ERROR.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ae1bf5:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
      return false;
    }
    (*gl->enable)(iVar3 + 0x3000);
    local_1b0.m_value = (*gl->getError)();
    if (local_1b0.m_value != 0) {
      local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"glEnable(GL_CLIP_DISTANCE");
      std::ostream::operator<<(poVar1,iVar3);
      std::operator<<((ostream *)poVar1,") returned error code ");
      local_1b0.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," instead of GL_NO_ERROR.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00ae1bf5;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::EnableDisableTest(const glw::Functions& gl)
{
	/*  Check that calling Enable and Disable with GL_CLIP_DISTANCEi for all
	 available clip distances does not generate errors.
	 glw::GLint error_code = GL_NO_ERROR; */

	glw::GLint error_code = GL_NO_ERROR;

	/* Test glEnable */
	for (glw::GLint i = 0; i < m_gl_max_clip_distances_value; ++i)
	{
		gl.enable(GL_CLIP_DISTANCE0 + i);

		error_code = gl.getError();

		if (error_code != GL_NO_ERROR)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glEnable(GL_CLIP_DISTANCE" << i << ") returned error code "
							   << glu::getErrorStr(error_code) << " instead of GL_NO_ERROR."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	/* Test glDisable */
	for (glw::GLint i = 0; i < m_gl_max_clip_distances_value; ++i)
	{
		gl.disable(GL_CLIP_DISTANCE0 + i);

		error_code = gl.getError();

		if (error_code != GL_NO_ERROR)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glDisable(GL_CLIP_DISTANCE" << i << ") returned error code "
							   << glu::getErrorStr(error_code) << " instead of GL_NO_ERROR."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}